

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void cmDocumentation::WarnFormFromFilename(RequestedHelpItem *request,bool *result)

{
  bool bVar1;
  char *m1;
  string ext;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::GetFilenameLastExtension(&local_60,&request->Filename);
  cmsys::SystemTools::UpperCase(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = std::operator==(&local_60,".HTM");
  m1 = "Warning: HTML help format no longer supported";
  if (!bVar1) {
    bVar1 = std::operator==(&local_60,".HTML");
    if (!bVar1) {
      bVar1 = std::operator==(&local_60,".DOCBOOK");
      if (bVar1) {
        m1 = "Warning: Docbook help format no longer supported";
      }
      else {
        if ((local_60._M_string_length != 2) || (8 < (byte)(local_60._M_dataplus._M_p[1] - 0x31U)))
        goto LAB_00268424;
        m1 = "Warning: Man help format no longer supported";
      }
    }
  }
  request->HelpType = None;
  *result = true;
  cmSystemTools::Message(m1,(char *)0x0);
LAB_00268424:
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmDocumentation::WarnFormFromFilename(
  cmDocumentation::RequestedHelpItem& request, bool& result)
{
  std::string ext = cmSystemTools::GetFilenameLastExtension(request.Filename);
  ext = cmSystemTools::UpperCase(ext);
  if ((ext == ".HTM") || (ext == ".HTML"))
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: HTML help format no longer supported");
    }
  else if (ext == ".DOCBOOK")
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Docbook help format no longer supported");
    }
  // ".1" to ".9" should be manpages
  else if ((ext.length()==2) && (ext[1] >='1') && (ext[1]<='9'))
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Man help format no longer supported");
    }
}